

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O2

int lib::string::Upper(State *state)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  String *pSVar4;
  size_t i;
  ulong uVar5;
  anon_union_16_2_eed97686_for_String_2 *paVar6;
  string upper;
  StackAPI api;
  
  luna::StackAPI::StackAPI(&api,state);
  bVar2 = luna::StackAPI::CheckArgs<luna::ValueT>(&api,1,ValueT_String);
  iVar3 = 0;
  if (bVar2) {
    pSVar4 = luna::StackAPI::GetString(&api,0);
    uVar1 = pSVar4->length_;
    if ((pSVar4->super_GCObject).field_0x11 == '\0') {
      paVar6 = &pSVar4->field_1;
    }
    else {
      paVar6 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar4->field_1).str_;
    }
    upper._M_dataplus._M_p = (pointer)&upper.field_2;
    upper._M_string_length = 0;
    upper.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&upper);
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      toupper((uint)(byte)paVar6->str_buffer_[uVar5]);
      std::__cxx11::string::push_back((char)&upper);
    }
    luna::StackAPI::PushString(&api,&upper);
    std::__cxx11::string::~string((string *)&upper);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Upper(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_String))
            return 0;

        auto str = api.GetString(0);
        auto size = str->GetLength();
        auto c_str = reinterpret_cast<const unsigned char *>(str->GetCStr());

        std::string upper;
        upper.reserve(size);
        for (std::size_t i = 0; i < size; ++i)
            upper.push_back(std::toupper(c_str[i]));

        api.PushString(upper);
        return 1;
    }